

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_thread_cpumask_next(_Bool *global_mask,_Bool *local_mask,_Bool strict,int32_t *iter)

{
  int *in_RCX;
  byte in_DL;
  void *in_RSI;
  void *in_RDI;
  int32_t idx;
  int32_t i;
  int32_t base_idx;
  int local_2c;
  int local_28;
  
  if ((in_DL & 1) == 0) {
    memcpy(in_RSI,in_RDI,0x200);
  }
  else {
    memset(in_RSI,0,0x200);
    for (local_28 = 0; local_28 < 0x200; local_28 = local_28 + 1) {
      local_2c = *in_RCX + local_28;
      if (0x1ff < local_2c) {
        local_2c = local_2c + -0x200;
      }
      if ((*(byte *)((long)in_RDI + (long)local_2c) & 1) != 0) {
        *(undefined1 *)((long)in_RSI + (long)local_2c) = 1;
        *in_RCX = local_2c + 1;
        return;
      }
    }
  }
  return;
}

Assistant:

static void ggml_thread_cpumask_next(const bool * global_mask, bool * local_mask, bool strict, int32_t* iter) {
    if (!strict) {
        memcpy(local_mask, global_mask, GGML_MAX_N_THREADS);
        return;
    } else {
        memset(local_mask, 0, GGML_MAX_N_THREADS);
        int32_t base_idx = *iter;
        for (int32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
            int32_t idx = base_idx + i;
            if (idx >= GGML_MAX_N_THREADS) {
                // Just a cheaper modulo
                idx -= GGML_MAX_N_THREADS;
            }
            if (global_mask[idx]) {
                local_mask[idx] = 1;
                *iter = idx + 1;
                return;
            }
        }
    }
}